

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O3

CDAG * degreeOrdered(CDAG *__return_storage_ptr__,CGraph *g)

{
  long lVar1;
  EdgeIdx *pEVar2;
  long lVar3;
  VertexIdx *pVVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  VertexIdx *pVVar8;
  EdgeIdx *pEVar9;
  VertexIdx *pVVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  EdgeIdx EVar15;
  ulong uVar16;
  EdgeIdx EVar17;
  EdgeIdx EVar18;
  
  lVar1 = g->nVertices;
  EVar17 = 0;
  uVar16 = -(ulong)(lVar1 + 1U >> 0x3d != 0) | lVar1 * 8 + 8U;
  plVar7 = (long *)operator_new__(uVar16);
  uVar13 = -(ulong)(g->nEdges + 1U >> 0x3d != 0) | g->nEdges * 8 + 8U;
  pVVar8 = (VertexIdx *)operator_new__(uVar13);
  pEVar9 = (EdgeIdx *)operator_new__(uVar16);
  pVVar10 = (VertexIdx *)operator_new__(uVar13);
  *plVar7 = 0;
  *pEVar9 = 0;
  EVar18 = 0;
  if (0 < lVar1) {
    pEVar2 = g->offsets;
    lVar11 = 0;
    EVar17 = 0;
    EVar18 = 0;
    lVar12 = 0;
    lVar14 = 0;
    EVar15 = *pEVar2;
    do {
      lVar3 = pEVar2[lVar11 + 1];
      if (EVar15 < lVar3) {
        pVVar4 = g->nbors;
        lVar5 = pEVar2[lVar11];
        do {
          lVar6 = pVVar4[EVar15];
          if ((lVar3 - lVar5 < pEVar2[lVar6 + 1] - pEVar2[lVar6]) ||
             ((lVar11 < lVar6 && (lVar3 - lVar5 == pEVar2[lVar6 + 1] - pEVar2[lVar6])))) {
            pVVar8[lVar12] = lVar6;
            lVar12 = lVar12 + 1;
            EVar17 = EVar17 + 1;
          }
          else {
            pVVar10[lVar14] = lVar6;
            lVar14 = lVar14 + 1;
            EVar18 = EVar18 + 1;
          }
          EVar15 = EVar15 + 1;
        } while (EVar15 < lVar3);
      }
      lVar11 = lVar11 + 1;
      plVar7[lVar11] = lVar12;
      pEVar9[lVar11] = lVar14;
      EVar15 = lVar3;
    } while (lVar11 != lVar1);
    if (0 < lVar1) {
      lVar14 = 0;
      lVar12 = *plVar7;
      lVar11 = lVar1;
      do {
        lVar3 = plVar7[lVar14 + 1];
        if (lVar12 != lVar3) {
          uVar13 = lVar3 * 8 + lVar12 * -8 >> 3;
          lVar11 = 0x3f;
          if (uVar13 != 0) {
            for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          std::__introsort_loop<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<DegreeComp>>
                    (pVVar8 + lVar12,pVVar8 + lVar3,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<DegreeComp>)g);
          std::__final_insertion_sort<long*,__gnu_cxx::__ops::_Iter_comp_iter<DegreeComp>>
                    (pVVar8 + lVar12,pVVar8 + lVar3,(_Iter_comp_iter<DegreeComp>)g);
          lVar11 = g->nVertices;
        }
        lVar14 = lVar14 + 1;
        lVar12 = lVar3;
      } while (lVar14 < lVar11);
    }
  }
  (__return_storage_ptr__->outlist).nVertices = lVar1;
  (__return_storage_ptr__->outlist).nEdges = EVar17;
  (__return_storage_ptr__->outlist).offsets = plVar7;
  (__return_storage_ptr__->outlist).nbors = pVVar8;
  (__return_storage_ptr__->inlist).nVertices = lVar1;
  (__return_storage_ptr__->inlist).nEdges = EVar18;
  (__return_storage_ptr__->inlist).offsets = pEVar9;
  (__return_storage_ptr__->inlist).nbors = pVVar10;
  return __return_storage_ptr__;
}

Assistant:

CDAG degreeOrdered(CGraph *g) {
    CDAG ret;     // CDAG to be returned
    CGraph outdag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                     new VertexIdx[g->nEdges + 1]};  // Initialize DAG of out-edges
    CGraph indag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                    new VertexIdx[g->nEdges + 1]};   // Initialize DAG of in-edges
    EdgeIdx outcur = 0;
    EdgeIdx incur = 0;
    VertexIdx dest;
    VertexIdx degi;
    VertexIdx degdest;

    outdag.offsets[0] = 0;
    indag.offsets[0] = 0;
    for (VertexIdx i = 0; i < g->nVertices; ++i)   // Looping over all vertices in g
    {
        for (EdgeIdx j = g->offsets[i]; j < g->offsets[i + 1]; ++j)   // Looping over neighbors of i in g
        {
            dest = g->nbors[j];     // We are now looking at edge (i,dest)
            degi = g->offsets[i + 1] - g->offsets[i];   // Degree of i
            degdest = g->offsets[dest + 1] - g->offsets[dest];   // Degree of dest
            //printf("i=%lld dest=%lld degi=%lld degdest=%lld\n",i,dest,degi,degdest);

            //We now orient the edge depending of degi vs degdest.
            // We break ties according to vertex id.
            // In the output, the g-edge (i,dest) is either pointing to dest (in if condition) or pointing to i (in else condition).

            if (degi < degdest || (degi == degdest && i < dest)) {
                outdag.nbors[outcur] = dest;   // We want point edge from i to dest. So this directed edge is added to outdag.
                ++outcur;                      // Increment pointer in outdag.nbors and the number of edges in outdag.
                ++outdag.nEdges;
            } else {
                indag.nbors[incur] = dest;     // We point edge from dest to i. So this edge goes into indag.
                ++incur;                       // Pointer and number of edges incremented
                ++indag.nEdges;
            }
        }
        outdag.offsets[i +
                       1] = outcur;         // We have finished all edges incident to i, so we can update offsets in DAGs.
        indag.offsets[i + 1] = incur;
    }

    for (VertexIdx i = 0; i < g->nVertices; ++i)  // Loops over vertices
        std::sort(outdag.nbors + outdag.offsets[i], outdag.nbors + outdag.offsets[i + 1], DegreeComp(
                g)); // In outdag, sort all neighbors of i according to their degree. Note that DegreeComp gives the desired comparator.

    ret.outlist = outdag;
    ret.inlist = indag;

    return ret;
}